

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O1

bool dxil_spv::get_texel_offsets
               (Impl *impl,CallInst *instruction,uint32_t *image_flags,uint base_operand,
               uint num_coords,Id *offsets,bool instruction_is_gather)

{
  Impl *this;
  bool bVar1;
  undefined1 uVar2;
  ValueKind VVar3;
  Id IVar4;
  Value *pVVar5;
  Constant *pCVar6;
  APInt *pAVar7;
  _Rb_tree_iterator<spv::Capability> _Var8;
  int64_t iVar9;
  Operation *op;
  bool bVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  Builder *this_00;
  pair<std::_Rb_tree_iterator<spv::Capability>,_bool> pVar14;
  Capability local_64;
  Builder *local_60;
  uint *local_58;
  CallInst *local_50;
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  *local_48;
  Impl *local_40;
  Id *local_38;
  
  local_40 = impl;
  local_38 = offsets;
  local_60 = Converter::Impl::builder(impl);
  if (num_coords == 0) {
    uVar2 = 1;
    bVar1 = true;
    bVar10 = false;
  }
  else {
    local_48 = (_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&local_60->capabilities;
    bVar1 = true;
    bVar10 = false;
    uVar12 = base_operand;
    uVar13 = num_coords;
    local_58 = image_flags;
    do {
      pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar12);
      pVVar5 = LLVMBC::Internal::resolve_proxy(pVVar5);
      VVar3 = LLVMBC::Value::get_value_kind(pVVar5);
      uVar2 = (undefined1)VVar3;
      if (VVar3 != Undef) {
        pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar12);
        if (pVVar5 == (Value *)0x0) {
LAB_0016faa9:
          pCVar6 = (Constant *)0x0;
        }
        else {
          pCVar6 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar5);
          VVar3 = LLVMBC::Value::get_value_kind((Value *)pCVar6);
          if (VVar3 != ConstantInt) goto LAB_0016faa9;
        }
        if (pCVar6 == (Constant *)0x0) {
          local_64 = CapabilityImageGatherExtended;
          pVar14 = std::
                   _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                   ::_M_insert_unique<spv::Capability_const&>(local_48,&local_64);
          _Var8 = pVar14.first._M_node;
          bVar10 = true;
          bVar1 = false;
        }
        else {
          pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar6);
          _Var8._M_node = (_Base_ptr)LLVMBC::APInt::getSExtValue(pAVar7);
          if (_Var8._M_node != (_Base_ptr)0x0) {
            bVar10 = true;
          }
        }
        uVar2 = SUB81(_Var8._M_node,0);
        image_flags = local_58;
        if (pCVar6 == (Constant *)0x0) break;
      }
      uVar12 = uVar12 + 1;
      uVar13 = uVar13 - 1;
      image_flags = local_58;
    } while (uVar13 != 0);
  }
  if (bVar10) {
    uVar12 = ((byte)~bVar1 & 1) * 8 + 8;
    uVar2 = (undefined1)uVar12;
    *image_flags = *image_flags | uVar12;
    if (num_coords != 0) {
      uVar11 = 0;
      this_00 = local_60;
      local_50 = instruction;
      do {
        uVar12 = base_operand + (int)uVar11;
        pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar12);
        pVVar5 = LLVMBC::Internal::resolve_proxy(pVVar5);
        VVar3 = LLVMBC::Value::get_value_kind(pVVar5);
        if (VVar3 == Undef) {
          IVar4 = spv::Builder::makeIntegerType(this_00,0x20,true);
          uVar12 = 0;
LAB_0016fbf0:
          IVar4 = spv::Builder::makeIntConstant(this_00,IVar4,uVar12,false);
        }
        else {
          pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar12);
          if (bVar1) {
            pCVar6 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar5);
            VVar3 = LLVMBC::Value::get_value_kind((Value *)pCVar6);
            if (VVar3 != ConstantInt) {
              pCVar6 = (Constant *)0x0;
            }
            pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar6);
            iVar9 = LLVMBC::APInt::getSExtValue(pAVar7);
            IVar4 = spv::Builder::makeIntegerType(this_00,0x20,true);
            uVar12 = (uint)iVar9;
            goto LAB_0016fbf0;
          }
          IVar4 = spv::Builder::makeIntegerType(this_00,0x20,true);
          this = local_40;
          op = Converter::Impl::allocate(local_40,OpBitcast,IVar4);
          Converter::Impl::add(this,op,false);
          this_00 = local_60;
          IVar4 = Converter::Impl::get_id_for_value(this,pVVar5,0);
          Operation::add_id(op,IVar4);
          IVar4 = op->id;
          instruction = local_50;
        }
        uVar2 = (undefined1)IVar4;
        local_38[uVar11] = IVar4;
        uVar11 = uVar11 + 1;
      } while (num_coords != uVar11);
    }
  }
  return (bool)uVar2;
}

Assistant:

static bool get_texel_offsets(Converter::Impl &impl, const llvm::CallInst *instruction, uint32_t &image_flags,
                              unsigned base_operand, unsigned num_coords, spv::Id *offsets,
                              bool instruction_is_gather)
{
	auto &builder = impl.builder();

	bool is_const_offset = true;
	bool has_non_zero_offset = false;

	for (unsigned i = 0; i < num_coords; i++)
	{
		// Treat undefined offset as 0, since we can.
		if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(base_operand + i)))
		{
			auto *constant_arg = llvm::dyn_cast<llvm::ConstantInt>(instruction->getOperand(base_operand + i));
			if (constant_arg)
			{
				if (constant_arg->getUniqueInteger().getSExtValue() != 0)
					has_non_zero_offset = true;
			}
			else
			{
				builder.addCapability(spv::CapabilityImageGatherExtended);
				is_const_offset = false;
				has_non_zero_offset = true;
				break;
			}
		}
	}

	// Don't bother emitting offset if they are all 0.
	if (!has_non_zero_offset)
		return true;

	if (is_const_offset)
		image_flags |= spv::ImageOperandsConstOffsetMask;
	else
		image_flags |= spv::ImageOperandsOffsetMask;

	for (unsigned i = 0; i < num_coords; i++)
	{
		if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(base_operand + i)))
		{
			auto operand = instruction->getOperand(base_operand + i);
			if (is_const_offset)
			{
				auto *constant_arg = llvm::dyn_cast<llvm::ConstantInt>(operand);
				offsets[i] = builder.makeIntConstant(int(constant_arg->getUniqueInteger().getSExtValue()));
			}
			else
			{
				// Makes sure when we build the array, it's the correct element type.
				auto *cast_op = impl.allocate(spv::OpBitcast, builder.makeIntegerType(32, true));
				impl.add(cast_op);
				cast_op->add_id(impl.get_id_for_value(operand));
				offsets[i] = cast_op->id;
			}
		}
		else
			offsets[i] = builder.makeIntConstant(0);
	}

	return true;
}